

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

int tlsio_openssl_open(CONCRETE_IO_HANDLE tls_io,ON_IO_OPEN_COMPLETE on_io_open_complete,
                      void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
                      void *on_bytes_received_context,ON_IO_ERROR on_io_error,
                      void *on_io_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  SSL_METHOD *meth;
  SSL_CTX *pSVar3;
  BIO_METHOD *pBVar4;
  BIO *pBVar5;
  long lVar6;
  SSL *ssl;
  undefined8 uVar7;
  size_t sVar8;
  int iVar9;
  char *pcVar10;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x58e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x58e;
    }
    pcVar10 = "NULL tls_io.";
    iVar9 = 0x58f;
LAB_0010a9ad:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_open",iVar9,1,pcVar10);
    return iVar1;
  }
  if (*(int *)((long)tls_io + 0x68) != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x598;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x598;
    }
    pcVar10 = "Invalid tlsio_state. Expected state is TLSIO_STATE_NOT_OPEN.";
    iVar9 = 0x597;
    goto LAB_0010a9ad;
  }
  *(ON_IO_OPEN_COMPLETE *)((long)tls_io + 0x10) = on_io_open_complete;
  *(void **)((long)tls_io + 0x30) = on_io_open_complete_context;
  *(ON_BYTES_RECEIVED *)((long)tls_io + 8) = on_bytes_received;
  *(void **)((long)tls_io + 0x28) = on_bytes_received_context;
  *(ON_IO_ERROR *)((long)tls_io + 0x20) = on_io_error;
  *(void **)((long)tls_io + 0x40) = on_io_error_context;
  *(undefined4 *)((long)tls_io + 0x68) = 1;
  meth = (SSL_METHOD *)TLS_method();
  pSVar3 = SSL_CTX_new(meth);
  *(SSL_CTX **)((long)tls_io + 0x50) = pSVar3;
  if (pSVar3 == (SSL_CTX *)0x0) {
    pcVar10 = "Failed allocating OpenSSL context.";
  }
  else {
    if ((*(long *)((long)tls_io + 0xb0) != 0) &&
       (iVar1 = engine_load((TLS_IO_INSTANCE *)tls_io), iVar1 != 0)) {
      SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
      *(undefined8 *)((long)tls_io + 0x50) = 0;
      goto LAB_0010aa8c;
    }
    if ((*(char **)((long)tls_io + 0x78) == (char *)0x0) ||
       (iVar1 = SSL_CTX_set_cipher_list
                          (*(SSL_CTX **)((long)tls_io + 0x50),*(char **)((long)tls_io + 0x78)),
       iVar1 == 1)) {
      iVar1 = add_certificate_to_store((TLS_IO_INSTANCE *)tls_io,*(char **)((long)tls_io + 0x70));
      if (iVar1 == 0) {
        if (((*(char **)((long)tls_io + 0x80) == (char *)0x0) ||
            (*(char **)((long)tls_io + 0x88) == (char *)0x0)) ||
           (iVar1 = x509_openssl_add_credentials
                              (*(SSL_CTX **)((long)tls_io + 0x50),*(char **)((long)tls_io + 0x80),
                               *(char **)((long)tls_io + 0x88),
                               *(OPTION_OPENSSL_KEY_TYPE *)((long)tls_io + 200),
                               *(ENGINE **)((long)tls_io + 0xc0)), iVar1 == 0)) {
          SSL_CTX_set_cert_verify_callback
                    (*(SSL_CTX **)((long)tls_io + 0x50),*(cb **)((long)tls_io + 0x98),
                     *(void **)((long)tls_io + 0xa0));
          pBVar4 = BIO_s_mem();
          pBVar5 = BIO_new(pBVar4);
          *(BIO **)((long)tls_io + 0x58) = pBVar5;
          if (pBVar5 == (BIO *)0x0) {
            engine_destroy((TLS_IO_INSTANCE *)tls_io);
            SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
            *(undefined8 *)((long)tls_io + 0x50) = 0;
            pcVar10 = "Failed BIO_new for in BIO.";
          }
          else {
            pBVar4 = BIO_s_mem();
            pBVar5 = BIO_new(pBVar4);
            *(BIO **)((long)tls_io + 0x60) = pBVar5;
            if (pBVar5 == (BIO *)0x0) {
              BIO_free(*(BIO **)((long)tls_io + 0x58));
              engine_destroy((TLS_IO_INSTANCE *)tls_io);
              SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
              *(undefined8 *)((long)tls_io + 0x50) = 0;
              pcVar10 = "Failed BIO_new for out BIO.";
            }
            else {
              lVar6 = BIO_ctrl(*(BIO **)((long)tls_io + 0x58),0x82,-1,(void *)0x0);
              if ((lVar6 < 1) ||
                 (lVar6 = BIO_ctrl(*(BIO **)((long)tls_io + 0x60),0x82,-1,(void *)0x0), lVar6 < 1))
              {
                BIO_free(*(BIO **)((long)tls_io + 0x58));
                BIO_free(*(BIO **)((long)tls_io + 0x60));
                engine_destroy((TLS_IO_INSTANCE *)tls_io);
                SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
                *(undefined8 *)((long)tls_io + 0x50) = 0;
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
                            ,"create_openssl_instance",0x495,1,"Failed BIO_set_mem_eof_return.");
                }
                goto LAB_0010aa8c;
              }
              SSL_CTX_set_verify(*(SSL_CTX **)((long)tls_io + 0x50),1,(callback *)0x0);
              iVar1 = SSL_CTX_set_default_verify_paths(*(SSL_CTX **)((long)tls_io + 0x50));
              if ((iVar1 != 1) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0))
              {
                (*p_Var2)(AZ_LOG_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
                          ,"create_openssl_instance",0x4a0,1,
                          "WARNING: Unable to specify the default location for CA certificates on this platform."
                         );
              }
              ssl = SSL_new(*(SSL_CTX **)((long)tls_io + 0x50));
              *(SSL **)((long)tls_io + 0x48) = ssl;
              if (ssl == (SSL *)0x0) {
                BIO_free(*(BIO **)((long)tls_io + 0x58));
                BIO_free(*(BIO **)((long)tls_io + 0x60));
                engine_destroy((TLS_IO_INSTANCE *)tls_io);
                SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
                *(undefined8 *)((long)tls_io + 0x50) = 0;
                pcVar10 = "Failed creating OpenSSL instance.";
              }
              else {
                lVar6 = SSL_ctrl(ssl,0x37,0,*(void **)((long)tls_io + 0xa8));
                if (lVar6 == 1) {
                  if (*(char *)((long)tls_io + 0xb8) != '\0') goto LAB_0010ac91;
                  uVar7 = SSL_get0_param(*(undefined8 *)((long)tls_io + 0x48));
                  X509_VERIFY_PARAM_set_hostflags(uVar7,0);
                  iVar1 = X509_VERIFY_PARAM_set1_ip_asc(uVar7,*(undefined8 *)((long)tls_io + 0xa8));
                  if (iVar1 == 0) {
                    pcVar10 = *(char **)((long)tls_io + 0xa8);
                    sVar8 = strlen(pcVar10);
                    iVar1 = X509_VERIFY_PARAM_set1_host(uVar7,pcVar10,sVar8);
                    if (iVar1 == 0) {
                      SSL_free(*(SSL **)((long)tls_io + 0x48));
                      *(undefined8 *)((long)tls_io + 0x48) = 0;
                      BIO_free(*(BIO **)((long)tls_io + 0x58));
                      BIO_free(*(BIO **)((long)tls_io + 0x60));
                      SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
                      *(undefined8 *)((long)tls_io + 0x50) = 0;
                      pcVar10 = "Failed to configure domain name verification.";
                      goto LAB_0010aa87;
                    }
                  }
                  SSL_set_verify(*(SSL **)((long)tls_io + 0x48),1,(callback *)0x0);
LAB_0010ac91:
                  SSL_set_bio(*(SSL **)((long)tls_io + 0x48),*(BIO **)((long)tls_io + 0x58),
                              *(BIO **)((long)tls_io + 0x60));
                  SSL_set_connect_state(*(SSL **)((long)tls_io + 0x48));
                  iVar1 = xio_open(*tls_io,on_underlying_io_open_complete,tls_io,
                                   on_underlying_io_bytes_received,tls_io,on_underlying_io_error,
                                   tls_io);
                  if (iVar1 != 0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
                                ,"tlsio_openssl_open",0x5b0,1,"Failed opening the underlying I/O.");
                    }
                    close_openssl_instance((TLS_IO_INSTANCE *)tls_io);
                    *(undefined4 *)((long)tls_io + 0x68) = 0;
                    return 0x5b3;
                  }
                  return 0;
                }
                SSL_free(*(SSL **)((long)tls_io + 0x48));
                *(undefined8 *)((long)tls_io + 0x48) = 0;
                BIO_free(*(BIO **)((long)tls_io + 0x58));
                BIO_free(*(BIO **)((long)tls_io + 0x60));
                engine_destroy((TLS_IO_INSTANCE *)tls_io);
                SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
                *(undefined8 *)((long)tls_io + 0x50) = 0;
                pcVar10 = "Failed setting SNI hostname hint.";
              }
            }
          }
        }
        else {
          engine_destroy((TLS_IO_INSTANCE *)tls_io);
          SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
          *(undefined8 *)((long)tls_io + 0x50) = 0;
          pcVar10 = "unable to use x509 authentication";
        }
      }
      else {
        engine_destroy((TLS_IO_INSTANCE *)tls_io);
        SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
        *(undefined8 *)((long)tls_io + 0x50) = 0;
        pcVar10 = "unable to add_certificate_to_store.";
      }
    }
    else {
      engine_destroy((TLS_IO_INSTANCE *)tls_io);
      SSL_CTX_free(*(SSL_CTX **)((long)tls_io + 0x50));
      *(undefined8 *)((long)tls_io + 0x50) = 0;
      pcVar10 = "unable to set cipher list.";
    }
  }
LAB_0010aa87:
  log_ERR_get_error(pcVar10);
LAB_0010aa8c:
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_open",0x5a9,1,"Failed creating the OpenSSL instance.");
  }
  *(undefined4 *)((long)tls_io + 0x68) = 0;
  return 0x5ab;
}

Assistant:

int tlsio_openssl_open(CONCRETE_IO_HANDLE tls_io, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result;

    if (tls_io == NULL)
    {
        result = MU_FAILURE;
        LogError("NULL tls_io.");
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (tls_io_instance->tlsio_state != TLSIO_STATE_NOT_OPEN)
        {
            LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_NOT_OPEN.");
            result = MU_FAILURE;
        }
        else
        {
            tls_io_instance->on_io_open_complete = on_io_open_complete;
            tls_io_instance->on_io_open_complete_context = on_io_open_complete_context;

            tls_io_instance->on_bytes_received = on_bytes_received;
            tls_io_instance->on_bytes_received_context = on_bytes_received_context;

            tls_io_instance->on_io_error = on_io_error;
            tls_io_instance->on_io_error_context = on_io_error_context;

            tls_io_instance->tlsio_state = TLSIO_STATE_OPENING_UNDERLYING_IO;

            if (create_openssl_instance(tls_io_instance) != 0)
            {
                LogError("Failed creating the OpenSSL instance.");
                tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
                result = MU_FAILURE;
            }
            else if (xio_open(tls_io_instance->underlying_io, on_underlying_io_open_complete, tls_io_instance,
                on_underlying_io_bytes_received, tls_io_instance, on_underlying_io_error, tls_io_instance) != 0)
            {
                LogError("Failed opening the underlying I/O.");
                close_openssl_instance(tls_io_instance);
                tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}